

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_mul(sexp ctx,sexp a,sexp b)

{
  sexp psVar1;
  sexp imag;
  sexp real;
  sexp res;
  sexp local_78;
  sexp local_70;
  sexp_gc_var_t local_68;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &local_78;
  local_68.var = &local_58;
  local_58 = (sexp)0x43e;
  local_40.var = &local_70;
  local_70 = (sexp)0x43e;
  local_78 = (sexp)0x43e;
  local_40.next = &local_68;
  local_68.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  (ctx->value).context.saves = &local_50;
  local_70 = sexp_mul(ctx,(a->value).type.name,(b->value).type.name);
  local_58 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.cpl);
  local_70 = sexp_sub(ctx,local_70,local_58);
  local_78 = sexp_mul(ctx,(a->value).type.name,(b->value).type.cpl);
  local_58 = sexp_mul(ctx,(a->value).type.cpl,(b->value).type.name);
  local_78 = sexp_add(ctx,local_78,local_58);
  local_58 = sexp_make_complex(ctx,local_70,local_78);
  (ctx->value).context.saves = local_68.next;
  psVar1 = sexp_complex_normalize(local_58);
  return psVar1;
}

Assistant:

sexp sexp_complex_mul (sexp ctx, sexp a, sexp b) {
  sexp_gc_var3(res, real, imag);
  sexp_gc_preserve3(ctx, res, real, imag);
  real = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_real(b));
  res = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_imag(b));
  real = sexp_sub(ctx, real, res);
  imag = sexp_mul(ctx, sexp_complex_real(a), sexp_complex_imag(b));
  res = sexp_mul(ctx, sexp_complex_imag(a), sexp_complex_real(b));
  imag = sexp_add(ctx, imag, res);
  res = sexp_make_complex(ctx, real, imag);
  sexp_gc_release3(ctx);
  return sexp_complex_normalize(res);
}